

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5Array.cpp
# Opt level: O1

void __thiscall
Js::ES5Array::ExtractSnapObjectDataInto(ES5Array *this,SnapObject *objData,SlabAllocator *alloc)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint *puVar6;
  DynamicTypeHandler *pDVar7;
  SnapES5ArrayGetterSetterEntry *pSVar8;
  ulong uVar9;
  undefined8 local_60;
  void *descriptorValidationToken;
  SnapArrayInfo<void_*> *local_50;
  SlabAllocatorBase<0> *local_48;
  size_t local_40;
  byte *local_38;
  IndexPropertyDescriptor *descriptor;
  
  descriptorValidationToken = objData;
  local_50 = TTD::NSSnapObjects::ExtractArrayValues<void*>(&this->super_JavascriptArray,alloc);
  puVar6 = (uint *)TTD::SlabAllocatorBase<0>::SlabAllocateTypeRawSize<32ul>(alloc);
  uVar2 = (this->super_JavascriptArray).super_ArrayObject.length;
  pDVar7 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  iVar4 = (*pDVar7->_vptr_DynamicTypeHandler[0x41])(pDVar7);
  *(char *)(puVar6 + 6) = (char)iVar4;
  *puVar6 = 0;
  local_40 = (size_t)(uVar2 + 1);
  local_48 = alloc;
  pSVar8 = TTD::SlabAllocatorBase<0>::
           SlabReserveArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(alloc,local_40);
  *(SnapES5ArrayGetterSetterEntry **)(puVar6 + 2) = pSVar8;
  local_38 = (byte *)0x0;
  local_60 = 0;
  pDVar7 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  for (uVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x46])(pDVar7,0xffffffff,&local_38,&local_60);
      uVar5 < uVar2;
      uVar5 = (*pDVar7->_vptr_DynamicTypeHandler[0x46])(pDVar7,(ulong)uVar5,&local_38,&local_60)) {
    bVar1 = *local_38;
    if ((bVar1 & 8) == 0) {
      lVar3 = *(long *)(puVar6 + 2);
      uVar9 = (ulong)*puVar6;
      *puVar6 = *puVar6 + 1;
      *(uint *)(lVar3 + uVar9 * 0x18) = uVar5;
      *(byte *)(lVar3 + 4 + uVar9 * 0x18) = bVar1;
      *(undefined8 *)(lVar3 + 8 + uVar9 * 0x18) = 0;
      *(undefined8 *)(lVar3 + 8 + uVar9 * 0x18) = *(undefined8 *)(local_38 + 8);
      *(undefined8 *)(lVar3 + 0x10 + uVar9 * 0x18) = 0;
      *(undefined8 *)(lVar3 + 0x10 + uVar9 * 0x18) = *(undefined8 *)(local_38 + 0x10);
    }
    pDVar7 = DynamicObject::GetTypeHandler((DynamicObject *)this);
  }
  if ((ulong)*puVar6 == 0) {
    TTD::SlabAllocatorBase<0>::
    SlabAbortArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(local_48,local_40);
    puVar6[2] = 0;
    puVar6[3] = 0;
  }
  else {
    TTD::SlabAllocatorBase<0>::
    SlabCommitArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>
              (local_48,(ulong)*puVar6,local_40);
  }
  *(SnapArrayInfo<void_*> **)(puVar6 + 4) = local_50;
  if (*(int *)((long)descriptorValidationToken + 8) == 0x16) {
    *(uint **)((long)descriptorValidationToken + 0x40) = puVar6;
    return;
  }
  TTDAbort_unrecoverable_error("Tag does not match.");
}

Assistant:

void ES5Array::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapArrayInfo<TTD::TTDVar>* sai = TTD::NSSnapObjects::ExtractArrayValues<TTD::TTDVar>(this, alloc);

        TTD::NSSnapObjects::SnapES5ArrayInfo* es5ArrayInfo = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapES5ArrayInfo>();

        //
        //TODO: reserving memory for entire length might be a problem if we have very large sparse arrays.
        //

        uint32 length = this->GetLength();

        es5ArrayInfo->IsLengthWritable = this->IsLengthWritable();
        es5ArrayInfo->GetterSetterCount = 0;
        es5ArrayInfo->GetterSetterEntries = alloc.SlabReserveArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(length + 1); //ensure we don't do a 0 reserve

        uint32 descriptorIndex = Js::JavascriptArray::InvalidIndex;
        IndexPropertyDescriptor* descriptor = nullptr;
        void* descriptorValidationToken = nullptr;

        do
        {
            descriptorIndex = this->GetNextDescriptor(descriptorIndex, &descriptor, &descriptorValidationToken);
            if(descriptorIndex == Js::JavascriptArray::InvalidIndex || descriptorIndex >= length)
            {
                break;
            }

            if((descriptor->Attributes & PropertyDeleted) != PropertyDeleted)
            {
                TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry* entry = es5ArrayInfo->GetterSetterEntries + es5ArrayInfo->GetterSetterCount;
                es5ArrayInfo->GetterSetterCount++;

                entry->Index = (uint32)descriptorIndex;
                entry->Attributes = descriptor->Attributes;

                entry->Getter = nullptr;
                if(descriptor->Getter != nullptr)
                {
                    entry->Getter = descriptor->Getter;
                }

                entry->Setter = nullptr;
                if(descriptor->Setter != nullptr)
                {
                    entry->Setter = descriptor->Setter;
                }
            }

        } while(true);

        if(es5ArrayInfo->GetterSetterCount != 0)
        {
            alloc.SlabCommitArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(es5ArrayInfo->GetterSetterCount, length + 1);
        }
        else
        {
            alloc.SlabAbortArraySpace<TTD::NSSnapObjects::SnapES5ArrayGetterSetterEntry>(length + 1);
            es5ArrayInfo->GetterSetterEntries = nullptr;
        }

        es5ArrayInfo->BasicArrayData = sai;

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapES5ArrayInfo*, TTD::NSSnapObjects::SnapObjectType::SnapES5ArrayObject>(objData, es5ArrayInfo);
    }